

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main_FCBPNN_classify(void)

{
  double dVar1;
  ostream *poVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  allocator_type local_109;
  vector<double,_std::allocator<double>_> output;
  double local_f0;
  _Vector_base<double,_std::allocator<double>_> local_e8;
  double local_c8 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  samples;
  FC_BPNN bp;
  
  FC_BPNN::FC_BPNN(&bp,2,10,1);
  samples.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  samples.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  samples.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  labels.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  labels.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  labels.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&output,__l,(allocator_type *)local_c8);
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&samples,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&output,__l_00,(allocator_type *)local_c8);
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&labels,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ff0000000000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&output,__l_01,(allocator_type *)local_c8);
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&samples,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&output,__l_02,(allocator_type *)local_c8);
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&labels,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ff0000000000000;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&output,__l_03,(allocator_type *)local_c8);
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&samples,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&output,__l_04,(allocator_type *)local_c8);
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&labels,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&output,__l_05,(allocator_type *)local_c8);
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&samples,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&output,__l_06,(allocator_type *)local_c8);
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&labels,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  uVar4 = 0;
  uVar5 = 0;
  for (uVar3 = 1; uVar3 != 0x7d1; uVar3 = uVar3 + 1) {
    local_f0 = FC_BPNN::train_once(&bp,samples.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + (uVar3 & 3),
                                   labels.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (uVar3 & 3));
    local_f0 = (double)CONCAT44(uVar5,uVar4) + local_f0;
    if ((ushort)((ushort)uVar3 % 100) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"iter: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar3);
      std::operator<<(poVar2," cost: ");
      poVar2 = std::ostream::_M_insert<double>(local_f0 / 100.0);
      std::operator<<(poVar2," step: ");
      dVar1 = FC_BPNN::getLearningStep(&bp);
      poVar2 = std::ostream::_M_insert<double>(dVar1);
      local_f0 = 0.0;
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    uVar4 = SUB84(local_f0,0);
    uVar5 = (undefined4)((ulong)local_f0 >> 0x20);
  }
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8[0] = 0.1;
  local_c8[1] = 0.2;
  __l_07._M_len = 2;
  __l_07._M_array = local_c8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_e8,__l_07,&local_109);
  FC_BPNN::predict(&bp,(vector<double,_std::allocator<double>_> *)&local_e8,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_e8);
  std::operator<<((ostream *)&std::cout,"prediction: ");
  poVar2 = std::ostream::_M_insert<double>
                     (*output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_c8[0] = 0.21;
  local_c8[1] = 0.9;
  __l_08._M_len = 2;
  __l_08._M_array = local_c8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_e8,__l_08,&local_109);
  FC_BPNN::predict(&bp,(vector<double,_std::allocator<double>_> *)&local_e8,&output);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_e8);
  std::operator<<((ostream *)&std::cout,"prediction: ");
  poVar2 = std::ostream::_M_insert<double>
                     (*output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&labels);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&samples);
  FC_BPNN::~FC_BPNN(&bp);
  return 1;
}

Assistant:

int main_FCBPNN_classify() {
	FC_BPNN bp(2, 10, 1);

	std::vector<std::vector<double>> samples;
	std::vector<std::vector<double>> labels;
	samples.push_back({ 1.0,0.0 }); labels.push_back({ 1.0 });
	samples.push_back({ 0.0,1.0 }); labels.push_back({ 1.0 });
	samples.push_back({ 1.0,1.0 }); labels.push_back({ 0.0 });
	samples.push_back({ 0.0,0.0 }); labels.push_back({ 0.0 });
	double cost = 0.0;
	for (int i = 1; i <= 2000; i++) {
		cost += bp.train_once(samples[i % 4], labels[i % 4]);
		if (i % 100 == 0) {
			cost /= 100;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			cost = 0.0;
		}
	}
	std::vector<double> output;
	bp.predict({ 0.1, 0.2}, output);
	std::cout << "prediction: " << output[0] << std::endl;
	bp.predict({ 0.21, 0.9 }, output);
	std::cout << "prediction: " << output[0] << std::endl;
	return 1;
}